

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O2

void __thiscall xray_re::xr_spawn_object::load(xr_spawn_object *this,xr_reader *r)

{
  undefined1 *value;
  uint uVar1;
  uint *puVar2;
  uint8_t *puVar3;
  float *pfVar4;
  uint32_t *puVar5;
  size_t sVar6;
  char *pcVar7;
  cse_abstract *this_00;
  uint16_t version;
  xr_custom_object_vec objects;
  
  sVar6 = xr_reader::r_chunk<unsigned_short>(r,0xe411,&version);
  if (sVar6 == 0) {
    pcVar7 = "0";
    uVar1 = 0x31;
  }
  else {
    if (version == 0x14) {
      xr_custom_object::load(&this->super_xr_custom_object,r);
      sVar6 = xr_reader::find_chunk(r,0xe419);
      value = &(this->super_xr_custom_object).field_0x6c;
      if (sVar6 == 0) {
        xr_reader::r_chunk<unsigned_int>(r,0xe417,(uint *)value);
        if (*(int *)value == 1) {
          sVar6 = xr_reader::find_chunk(r,0xe422);
          if (sVar6 == 0) {
            pcVar7 = "0";
            uVar1 = 0x50;
            goto LAB_0017c434;
          }
          pfVar4 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
          (this->field_1).field_1.m_radius = *pfVar4;
          pfVar4 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
          (this->field_1).field_1.m_power = *pfVar4;
          pfVar4 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
          (this->field_1).field_1.m_view_distance = *pfVar4;
          puVar5 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
          (this->field_1).field_1.m_fog_color = *puVar5;
          pfVar4 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
          (this->field_1).field_1.m_fog_density = *pfVar4;
          puVar5 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
          (this->field_1).field_1.m_ambient_color = *puVar5;
          puVar5 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
          (this->field_1).field_1.m_sky_color = *puVar5;
          xr_reader::r_chunk<unsigned_int>(r,0xe423,&(this->field_1).field_1.m_hemi_color);
        }
        else {
          if (*(int *)value != 0) {
            pcVar7 = "0";
            uVar1 = 0x5b;
            goto LAB_0017c434;
          }
          sVar6 = xr_reader::find_chunk(r,0xe413);
          if (sVar6 == 0) {
            pcVar7 = "0";
            uVar1 = 0x48;
            goto LAB_0017c434;
          }
          puVar3 = (r->field_2).m_p;
          (r->field_2).m_p = puVar3 + 1;
          (this->field_1).field_0.m_team = *puVar3;
          puVar3 = (r->field_2).m_p;
          (r->field_2).m_p = puVar3 + 1;
          (this->field_1).field_0.m_respawn = *puVar3;
          puVar3 = (r->field_2).m_p;
          (r->field_2).m_p = puVar3 + 1;
          (this->field_1).field_0.m_game = *puVar3;
          xr_reader::advance(r,1);
        }
      }
      else {
        *(undefined4 *)value = 2;
        pcVar7 = xr_reader::skip_sz(r);
        sVar6 = xr_reader::find_chunk(r,0xe420);
        if (sVar6 == 0) {
          pcVar7 = "0";
          uVar1 = 0x3c;
          goto LAB_0017c434;
        }
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        uVar1 = *puVar2;
        xr_packet::xr_packet((xr_packet *)&objects);
        xr_reader::r_packet(r,(xr_packet *)&objects,(ulong)uVar1);
        this_00 = create_entity(pcVar7);
        (this->field_1).m_entity = this_00;
        if (this_00 == (cse_abstract *)0x0) {
          pcVar7 = "m_entity";
          uVar1 = 0x42;
          goto LAB_0017c434;
        }
        cse_abstract::spawn_read(this_00,(xr_packet *)&objects);
      }
      objects.
      super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objects.
      super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objects.
      super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      xr_scene::load_objects((this->super_xr_custom_object).m_scene,r,0xe421,&objects);
      if (objects.
          super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          objects.
          super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (((long)objects.
                   super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)objects.
                   super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                   ._M_impl.super__Vector_impl_data._M_start != 8) ||
           ((*objects.
              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_class_id != TOOLS_CLASS_SHAPE)) {
          pcVar7 = "objects.size() == 1 && objects[0]->class_id() == TOOLS_CLASS_SHAPE";
          uVar1 = 0x62;
          goto LAB_0017c434;
        }
        this->m_attached_object =
             *objects.
              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
      }
      std::_Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      ~_Vector_base(&objects.
                     super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                   );
      return;
    }
    pcVar7 = "version == SPAWNPOINT_VERSION";
    uVar1 = 0x32;
  }
LAB_0017c434:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                ,uVar1,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
}

Assistant:

void xr_spawn_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(SPAWNPOINT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SPAWNPOINT_VERSION);

	xr_custom_object::load(r);

	if (r.find_chunk(SPAWNPOINT_CHUNK_SECTION)) {
		m_type = SPAWNPOINT_TYPE_ENTITY;
		const char* name = r.skip_sz();
		r.debug_find_chunk();

		if (!r.find_chunk(SPAWNPOINT_CHUNK_SPAWNDATA))
			xr_not_expected();
		size_t size = r.r_u32();
		xr_packet packet;
		r.r_packet(packet, size);
		r.debug_find_chunk();
		m_entity = create_entity(name);
		xr_assert(m_entity);
		m_entity->spawn_read(packet);
	} else {
		r.r_chunk<uint32_t>(SPAWNPOINT_CHUNK_TYPE, m_type);
		if (m_type == SPAWNPOINT_TYPE_RPOINT) {
			if (!r.find_chunk(SPAWNPOINT_CHUNK_RPOINT_PARAMS))
				xr_not_expected();
			m_team = r.r_u8();
			m_respawn = r.r_u8();
			m_game = r.r_u8();
			r.advance(sizeof(uint8_t));
			r.debug_find_chunk();
		} else if (m_type == SPAWNPOINT_TYPE_ENV_MOD) {
			if (!r.find_chunk(SPAWNPOINT_CHUNK_ENV_MOD_PARAMS))
				xr_not_expected();
			m_radius = r.r_float();
			m_power = r.r_float();
			m_view_distance = r.r_float();
			m_fog_color = r.r_u32();
			m_fog_density = r.r_float();
			m_ambient_color = r.r_u32();
			m_sky_color = r.r_u32();
			r.debug_find_chunk();
			r.r_chunk<uint32_t>(SPAWNPOINT_CHUNK_ENV_MOD_HEMI, m_hemi_color);
		} else {
			xr_not_expected();
		}
	}

	xr_custom_object_vec objects;
	scene().load_objects(r, SPAWNPOINT_CHUNK_ATTACHED_OBJECT, objects);
	if (!objects.empty()) {
		xr_assert(objects.size() == 1 && objects[0]->class_id() == TOOLS_CLASS_SHAPE);
		m_attached_object = objects[0];
	}
}